

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O2

void __thiscall MyServerConnection::OnConnect(MyServerConnection *this)

{
  ostringstream *this_00;
  int i;
  OutputWorker *this_01;
  long lVar1;
  MyServerConnection *this_02;
  pointer psVar2;
  LogStringBuffer *buffer;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  connections;
  TonkStatus status;
  uint8_t incompressible_a [100];
  uint8_t incompressible_b [200];
  
  test::LogTonkStatus(&this->super_SDKConnection);
  tonk::SDKConnection::GetStatus(&status,&this->super_SDKConnection);
  tonk::SDKConnectionList<MyServerConnection>::GetList(&connections,&this->Server->ConnectionList);
  this_00 = (ostringstream *)(incompressible_b + 0x10);
  buffer = (LogStringBuffer *)incompressible_b;
  for (psVar2 = connections.
                super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar2 != connections.
                super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
    tonk::SDKConnection::GetStatus
              ((TonkStatus *)incompressible_a,
               &((psVar2->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                )->super_SDKConnection);
    this_02 = (psVar2->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (this_02 != this) {
      if ((int)Logger.ChannelMinLevel < 3) {
        incompressible_b._0_8_ = Logger.ChannelName;
        incompressible_b[8] = '\x02';
        incompressible_b[9] = '\0';
        incompressible_b[10] = '\0';
        incompressible_b[0xb] = '\0';
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,(string *)&Logger.Prefix);
        std::operator<<((ostream *)this_00,"Broadcasting connection ");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," about ");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," connecting");
        this_01 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_01,buffer);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        this_02 = (psVar2->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
      }
      incompressible_b[1] = (undefined1)status.LocallyAssignedIdForRemoteHost;
      incompressible_b[2] = status.LocallyAssignedIdForRemoteHost._1_1_;
      incompressible_b[3] = status.LocallyAssignedIdForRemoteHost._2_1_;
      incompressible_b[4] = status.LocallyAssignedIdForRemoteHost._3_1_;
      incompressible_b[0] = '\x03';
      tonk::SDKConnection::Send(&this_02->super_SDKConnection,buffer,5,0x32);
    }
    incompressible_b[1] = incompressible_a[4];
    incompressible_b[2] = incompressible_a[5];
    incompressible_b[3] = incompressible_a[6];
    incompressible_b[4] = incompressible_a[7];
    incompressible_b[0] = '\x03';
    tonk::SDKConnection::Send(&this->super_SDKConnection,buffer,5,0x32);
  }
  for (lVar1 = 0; lVar1 != 100; lVar1 = lVar1 + 1) {
    incompressible_a[lVar1] = (uint8_t)lVar1;
  }
  lVar1 = 200;
  while (lVar1 != 0) {
    *(char *)&buffer->ChannelName = (char)lVar1;
    buffer = (LogStringBuffer *)((long)&buffer->ChannelName + 1);
    lVar1 = lVar1 + -1;
  }
  tonk::SDKConnection::Send(&this->super_SDKConnection,incompressible_a,100,0x9b);
  tonk::SDKConnection::Send(&this->super_SDKConnection,incompressible_b,200,0x37);
  std::
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  ::~vector(&connections);
  return;
}

Assistant:

void MyServerConnection::OnConnect()
{
    LogTonkStatus(this);

    TonkStatus status = GetStatus();

    auto connections = Server->ConnectionList.GetList();
    for (auto& connection : connections)
    {
        TonkStatus cs = connection->GetStatus();

        if (connection.get() != this)
        {
            Logger.Info("Broadcasting connection ", cs.LocallyAssignedIdForRemoteHost,
                " about ", status.LocallyAssignedIdForRemoteHost, " connecting");

            uint8_t data[1 + 4];
            data[0] = ID_ConnectionAdded;
            tonk::WriteU32_LE(data + 1, status.LocallyAssignedIdForRemoteHost);
            connection->Send(data, sizeof(data), TonkChannel_Reliable0);
        }

        uint8_t data[1 + 4];
        data[0] = ID_ConnectionAdded;
        tonk::WriteU32_LE(data + 1, cs.LocallyAssignedIdForRemoteHost);
        Send(data, sizeof(data), TonkChannel_Reliable0);
    }

    // Send two buffers in quick succession in unused channels.
    // The goal is to get the Flush() function to insert a sync
    // frame between these two buffers to test this rare case.
    static const int kBytesA = 100;
    static const int kBytesB = 200;
    uint8_t incompressible_a[kBytesA];
    uint8_t incompressible_b[kBytesB];
    for (int i = 0; i < kBytesA; ++i) {
        incompressible_a[i] = (uint8_t)(i);
    }
    for (int i = 0; i < kBytesB; ++i) {
        incompressible_b[i] = (uint8_t)(kBytesB - i);
    }
    Send(incompressible_a, kBytesA, TonkChannel_LowPri0 + 5);
    Send(incompressible_b, kBytesB, TonkChannel_Reliable0 + 5);
}